

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockExpectedCall_multiCallsMadeMoreThanExpectedTimesIsNotFulfilledAndCannotMatchActualCalls_TestShell
::
~TEST_MockExpectedCall_multiCallsMadeMoreThanExpectedTimesIsNotFulfilledAndCannotMatchActualCalls_TestShell
          (TEST_MockExpectedCall_multiCallsMadeMoreThanExpectedTimesIsNotFulfilledAndCannotMatchActualCalls_TestShell
           *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockExpectedCall, multiCallsMadeMoreThanExpectedTimesIsNotFulfilledAndCannotMatchActualCalls)
{
    MockCheckedExpectedCall expectedCall(3);
    expectedCall.withName("name");
    expectedCall.callWasMade(1);
    expectedCall.callWasMade(2);
    expectedCall.callWasMade(3);
    expectedCall.callWasMade(4);
    CHECK(!expectedCall.isFulfilled());
    CHECK(!expectedCall.canMatchActualCalls());
}